

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

bool __thiscall Js::AsmJsModuleCompiler::CommitModule(AsmJsModuleCompiler *this)

{
  Symbol *this_00;
  code *pcVar1;
  double dVar2;
  BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  ParseNodeVar *this_02;
  FunctionBody *funcInfo_00;
  bool bVar3;
  byte bVar4;
  Which WVar5;
  Type TVar6;
  ArgType AVar7;
  int iVar8;
  int val;
  RegSlot val_00;
  SymbolType SVar9;
  PropertyId PVar10;
  uint size_00;
  RegSlot RVar11;
  RegSlot RVar12;
  AsmJSMathBuiltinFunction AVar13;
  AsmJSTypedArrayBuiltinFunction AVar14;
  ParseNodeFnc *pPVar15;
  IdentPtr pid;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  AsmJsSymbol *symbol;
  ByteCodeGenerator *pBVar16;
  AsmJsSymbol **ppAVar17;
  ScriptContext *this_03;
  Recycler *pRVar18;
  AsmJsSlot *this_04;
  PropertyName pIVar19;
  AsmJsImportFunction *this_05;
  ModuleFunctionImport *pMVar20;
  AsmJsFunctionTable *this_06;
  ModuleFunctionTable *pMVar21;
  uint **ppuVar22;
  AsmJsFunc *this_07;
  ModuleFunction *pMVar23;
  AsmJsArrayView *this_08;
  AsmJsModuleArg *this_09;
  AsmJsMathConst *this_10;
  double *pdVar24;
  AsmJsMathFunction *this_11;
  AsmJsTypedArrayFunction *this_12;
  undefined4 *puVar25;
  float fVar26;
  AsmJsTypedArrayFunction *mathFunc_1;
  AsmJsMathFunction *mathFunc;
  AsmJsMathConst *constVar;
  AsmJsModuleArg *arg;
  AsmJsArrayView *var_2;
  ModuleFunction *modVar_3;
  AsmJsFunc *func_1;
  uint j;
  ModuleFunctionTable *modTable;
  RegSlot index;
  uint size;
  AsmJsFunctionTable *funcTable;
  ModuleFunctionImport *modVar_2;
  AsmJsImportFunction *func;
  ModuleVarImport *local_178;
  ModuleVarImport *modVar_1;
  AsmJsConstantImport *var_1;
  ModuleVar *local_160;
  ModuleVar *modVar;
  AsmJsVar *var;
  code *local_148;
  undefined8 local_140;
  TrackAllocData local_138;
  AsmJsSlot *local_110;
  AsmJsSlot *slot;
  AsmJsSymbol *sym;
  AsmJsSlotMap *pAStack_f8;
  int i;
  AsmJsSlotMap *slotMap;
  int local_e8;
  int moduleEnvCount;
  int iFuncImp;
  int iFunc;
  int iVarImp;
  int iVar;
  ModuleExport ex;
  AsmJsModuleExport *exMod;
  undefined1 local_b8 [4];
  int exportIndex;
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  exportIter;
  int varCount;
  int importFunctionCount;
  int functionTableCount;
  int functionCount;
  int argCount;
  TrackAllocData local_60;
  AsmJsSymbol *local_38;
  AsmJsClosureFunction *closure;
  ParseNodeVar *nameNode;
  AsmJsModuleInfo *asmInfo;
  FunctionBody *functionBody;
  FuncInfo *funcInfo;
  AsmJsModuleCompiler *this_local;
  
  funcInfo = (FuncInfo *)this;
  pPVar15 = GetModuleFunctionNode(this);
  functionBody = (FunctionBody *)pPVar15->funcInfo;
  asmInfo = (AsmJsModuleInfo *)FuncInfo::GetParsedFunctionBody((FuncInfo *)functionBody);
  nameNode = (ParseNodeVar *)FunctionBody::AllocateAsmJsModuleInfo((FunctionBody *)asmInfo);
  bVar3 = ParseableFunctionInfo::GetIsNamedFunctionExpression
                    ((ParseableFunctionInfo *)
                     functionBody[1].super_ParseableFunctionInfo.super_FunctionProxy.auxPtrs.ptr);
  if (bVar3) {
    pPVar15 = GetModuleFunctionNode(this);
    if (pPVar15->pnodeName == (ParseNodeVar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar25 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                  ,0x7e,"(GetModuleFunctionNode()->pnodeName)",
                                  "GetModuleFunctionNode()->pnodeName");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar25 = 0;
    }
    pPVar15 = GetModuleFunctionNode(this);
    if ((pPVar15->pnodeName->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar25 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                  ,0x7f,"(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl)",
                                  "GetModuleFunctionNode()->pnodeName->nop == knopVarDecl");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar25 = 0;
    }
    pPVar15 = GetModuleFunctionNode(this);
    closure = (AsmJsClosureFunction *)pPVar15->pnodeName;
    this_00 = ((ParseNodeVar *)closure)->sym;
    pBVar16 = GetByteCodeGenerator(this);
    bVar3 = Symbol::IsInSlot(this_00,pBVar16,(FuncInfo *)functionBody,false);
    if (bVar3) {
      pBVar16 = GetByteCodeGenerator(this);
      pid = ParseNode::name((ParseNode *)closure);
      ByteCodeGenerator::AssignPropertyId(pBVar16,pid);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&AsmJsClosureFunction::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                 ,0x85);
      alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this,&local_60);
      symbol = (AsmJsSymbol *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)alloc,0x3f67b0);
      AsmJsClosureFunction::AsmJsClosureFunction
                ((AsmJsClosureFunction *)symbol,
                 *(PropertyName *)&(closure->super_AsmJsFunctionDeclaration).mArgCount,
                 ClosureFunction,&this->mAllocator);
      local_38 = symbol;
      DefineIdentifier(this,*(PropertyName *)&(closure->super_AsmJsFunctionDeclaration).mArgCount,
                       symbol);
    }
  }
  if (this->mBufferArgName == (PropertyName)0x0) {
    if (this->mForeignArgName == (PropertyName)0x0) {
      functionTableCount = (int)(this->mStdLibArgName != (PropertyName)0x0);
    }
    else {
      functionTableCount = 2;
    }
  }
  else {
    functionTableCount = 3;
  }
  iVar8 = JsUtil::ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&(this->mFunctionArray).
                      super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>);
  val = JsUtil::ReadOnlyList<Js::AsmJsFunctionTable_*,_Memory::ArenaAllocator,_DefaultComparer>::
        Count(&(this->mFunctionTableArray).
               super_ReadOnlyList<Js::AsmJsFunctionTable_*,_Memory::ArenaAllocator,_DefaultComparer>
             );
  val_00 = WAsmJs::RegisterSpace::GetTotalVarCount(&this->mImportFunctions);
  AsmJsModuleInfo::SetFunctionCount((AsmJsModuleInfo *)nameNode,iVar8);
  AsmJsModuleInfo::SetFunctionTableCount((AsmJsModuleInfo *)nameNode,val);
  AsmJsModuleInfo::SetFunctionImportCount((AsmJsModuleInfo *)nameNode,val_00);
  AsmJsModuleInfo::SetVarCount((AsmJsModuleInfo *)nameNode,this->mVarCount);
  AsmJsModuleInfo::SetVarImportCount((AsmJsModuleInfo *)nameNode,this->mVarImportCount);
  AsmJsModuleInfo::SetArgInCount((AsmJsModuleInfo *)nameNode,functionTableCount);
  AsmJsModuleInfo::SetModuleMemory((AsmJsModuleInfo *)nameNode,&this->mModuleMemory);
  AsmJsModuleInfo::SetAsmMathBuiltinUsed
            ((AsmJsModuleInfo *)nameNode,(BVStatic<32UL>)(this->mAsmMathBuiltinUsedBV).data[0].word)
  ;
  AsmJsModuleInfo::SetAsmArrayBuiltinUsed
            ((AsmJsModuleInfo *)nameNode,(BVStatic<16UL>)(this->mAsmArrayBuiltinUsedBV).data[0].word
            );
  AsmJsModuleInfo::SetMaxHeapAccess((AsmJsModuleInfo *)nameNode,this->mMaxHeapAccess);
  exportIter.
  super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._28_4_ = 3;
  ParseableFunctionInfo::SetInParamsCount((ParseableFunctionInfo *)asmInfo,4);
  ParseableFunctionInfo::SetReportedInParamsCount((ParseableFunctionInfo *)asmInfo,4);
  FunctionBody::CheckAndSetConstantCount((FunctionBody *)asmInfo,2);
  FunctionBody::CreateConstantTable((FunctionBody *)asmInfo);
  FunctionBody::CheckAndSetVarCount
            ((FunctionBody *)asmInfo,
             exportIter.
             super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ._28_4_);
  ParseableFunctionInfo::SetIsAsmjsMode((ParseableFunctionInfo *)asmInfo,true);
  FunctionBody::NewObjectLiteral((FunctionBody *)asmInfo);
  funcInfo_00 = functionBody;
  pBVar16 = GetByteCodeGenerator(this);
  pPVar15 = GetModuleFunctionNode(this);
  AsmJSByteCodeGenerator::EmitEmptyByteCode
            ((FuncInfo *)funcInfo_00,pBVar16,&pPVar15->super_ParseNode);
  AsmJsModuleInfo::SetExportFunctionIndex((AsmJsModuleInfo *)nameNode,this->mExportFuncIndex);
  this_02 = nameNode;
  iVar8 = JsUtil::
          BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(&this->mExports);
  AsmJsModuleInfo::SetExportsCount((AsmJsModuleInfo *)this_02,iVar8);
  JsUtil::
  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::GetIterator((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 *)local_b8,&this->mExports);
  exMod._4_4_ = 0;
  while (bVar3 = JsUtil::
                 BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)local_b8), bVar3) {
    ex.location = (RegSlot *)
                  JsUtil::
                  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::
                  IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                  ::CurrentValue((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                                  *)local_b8);
    _iVarImp = AsmJsModuleInfo::GetExport((AsmJsModuleInfo *)nameNode,exMod._4_4_);
    *_iVarImp = *ex.location;
    *ex.id = ex.location[1];
    JsUtil::
    BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_b8);
    exMod._4_4_ = exMod._4_4_ + 1;
  }
  iFunc = 0;
  iFuncImp = 0;
  moduleEnvCount = 0;
  local_e8 = 0;
  slotMap._4_4_ =
       JsUtil::
       BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       ::Count(&this->mModuleEnvironment);
  AsmJsModuleInfo::InitializeSlotMap((AsmJsModuleInfo *)nameNode,slotMap._4_4_);
  pAStack_f8 = AsmJsModuleInfo::GetAsmJsSlotMap((AsmJsModuleInfo *)nameNode);
  sym._4_4_ = 0;
  do {
    if (slotMap._4_4_ <= sym._4_4_) {
      return true;
    }
    ppAVar17 = JsUtil::
               BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(&this->mModuleEnvironment,sym._4_4_);
    slot = (AsmJsSlot *)*ppAVar17;
    if (slot != (AsmJsSlot *)0x0) {
      this_03 = GetScriptContext(this);
      pRVar18 = ScriptContext::GetRecycler(this_03);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_138,(type_info *)&AsmJsSlot::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                 ,200);
      pRVar18 = Memory::Recycler::TrackAllocInfo(pRVar18,&local_138);
      local_148 = Memory::Recycler::AllocLeafInlined;
      local_140 = 0;
      this_04 = (AsmJsSlot *)new<Memory::Recycler>(0x18,pRVar18,0xa38830);
      this_04->location = 0;
      this_04->symType = Variable;
      (this_04->field_2).mathConstVal = 0.0;
      *(undefined8 *)&this_04->isConstVar = 0;
      AsmJsSlot::AsmJsSlot(this_04);
      local_110 = this_04;
      SVar9 = AsmJsSymbol::GetSymbolType((AsmJsSymbol *)slot);
      this_01 = pAStack_f8;
      local_110->symType = SVar9;
      pIVar19 = AsmJsSymbol::GetName((AsmJsSymbol *)slot);
      var._4_4_ = Ident::GetPropertyId(pIVar19);
      JsUtil::
      BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew(this_01,(int *)((long)&var + 4),&local_110);
      SVar9 = AsmJsSymbol::GetSymbolType((AsmJsSymbol *)slot);
      switch(SVar9) {
      case Variable:
        modVar = (ModuleVar *)AsmJsVar::FromSymbol((AsmJsSymbol *)slot);
        iVar8 = iFunc;
        iFunc = iFunc + 1;
        local_160 = AsmJsModuleInfo::GetVar((AsmJsModuleInfo *)nameNode,iVar8);
        RVar12 = AsmJsVarBase::GetLocation((AsmJsVarBase *)modVar);
        local_160->location = RVar12;
        var_1._7_1_ = AsmJsVarBase::GetVarType((AsmJsVarBase *)modVar);
        WVar5 = AsmJsVarType::which((AsmJsVarType *)((long)&var_1 + 7));
        local_160->type = WVar5;
        var_1._6_1_ = AsmJsVarBase::GetVarType((AsmJsVarBase *)modVar);
        bVar3 = AsmJsVarType::isInt((AsmJsVarType *)((long)&var_1 + 6));
        if (bVar3) {
          iVar8 = AsmJsVar::GetIntInitialiser((AsmJsVar *)modVar);
          (local_160->initialiser).intInit = iVar8;
        }
        else {
          var_1._5_1_ = AsmJsVarBase::GetVarType((AsmJsVarBase *)modVar);
          bVar3 = AsmJsVarType::isFloat((AsmJsVarType *)((long)&var_1 + 5));
          if (bVar3) {
            fVar26 = AsmJsVar::GetFloatInitialiser((AsmJsVar *)modVar);
            (local_160->initialiser).floatInit = fVar26;
          }
          else {
            var_1._4_1_ = AsmJsVarBase::GetVarType((AsmJsVarBase *)modVar);
            bVar3 = AsmJsVarType::isDouble((AsmJsVarType *)((long)&var_1 + 4));
            if (bVar3) {
              dVar2 = AsmJsVar::GetDoubleInitialiser((AsmJsVar *)modVar);
              (local_160->initialiser).doubleInit = dVar2;
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar25 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                          ,0xe1,"((0))","UNREACHED");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar25 = 0;
            }
          }
        }
        bVar4 = (**(code **)(*(long *)modVar + 8))();
        local_160->isMutable = (Type)(bVar4 & 1);
        local_110->location = local_160->location;
        var_1._3_1_ = AsmJsVarBase::GetVarType((AsmJsVarBase *)modVar);
        WVar5 = AsmJsVarType::which((AsmJsVarType *)((long)&var_1 + 3));
        (local_110->field_2).varType = WVar5;
        local_110->isConstVar = (Type)((local_160->isMutable ^ 0xffU) & 1);
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar25 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                    ,0x13c,"((0))","(0)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar25 = 0;
        break;
      case MathConstant:
        this_10 = AsmJsMathConst::FromSymbol((AsmJsSymbol *)slot);
        pdVar24 = AsmJsMathConst::GetVal(this_10);
        (local_110->field_2).mathConstVal = *pdVar24;
        break;
      case ConstantImport:
        modVar_1 = (ModuleVarImport *)AsmJsConstantImport::FromSymbol((AsmJsSymbol *)slot);
        iVar8 = iFuncImp;
        iFuncImp = iFuncImp + 1;
        local_178 = AsmJsModuleInfo::GetVarImport((AsmJsModuleInfo *)nameNode,iVar8);
        RVar12 = AsmJsVarBase::GetLocation((AsmJsVarBase *)modVar_1);
        local_178->location = RVar12;
        pIVar19 = AsmJsConstantImport::GetField((AsmJsConstantImport *)modVar_1);
        PVar10 = Ident::GetPropertyId(pIVar19);
        local_178->field = PVar10;
        func._7_1_ = AsmJsVarBase::GetVarType((AsmJsVarBase *)modVar_1);
        WVar5 = AsmJsVarType::which((AsmJsVarType *)((long)&func + 7));
        local_178->type = WVar5;
        local_110->location = local_178->location;
        (local_110->field_2).varType = local_178->type;
        break;
      case ImportFunction:
        this_05 = AsmJsImportFunction::FromSymbol((AsmJsSymbol *)slot);
        iVar8 = local_e8;
        local_e8 = local_e8 + 1;
        pMVar20 = AsmJsModuleInfo::GetFunctionImport((AsmJsModuleInfo *)nameNode,iVar8);
        RVar12 = AsmJsFunctionDeclaration::GetFunctionIndex
                           (&this_05->super_AsmJsFunctionDeclaration);
        pMVar20->location = RVar12;
        pIVar19 = AsmJsImportFunction::GetField(this_05);
        PVar10 = Ident::GetPropertyId(pIVar19);
        pMVar20->field = PVar10;
        local_110->location = pMVar20->location;
        break;
      case FuncPtrTable:
        this_06 = AsmJsFunctionTable::FromSymbol((AsmJsSymbol *)slot);
        size_00 = AsmJsFunctionTable::GetSize(this_06);
        RVar12 = AsmJsFunctionDeclaration::GetFunctionIndex
                           (&this_06->super_AsmJsFunctionDeclaration);
        AsmJsModuleInfo::SetFunctionTableSize((AsmJsModuleInfo *)nameNode,RVar12,size_00);
        pMVar21 = AsmJsModuleInfo::GetFunctionTable((AsmJsModuleInfo *)nameNode,RVar12);
        for (func_1._4_4_ = 0; func_1._4_4_ < size_00; func_1._4_4_ = func_1._4_4_ + 1) {
          RVar11 = AsmJsFunctionTable::GetModuleFunctionIndex(this_06,func_1._4_4_);
          ppuVar22 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                               ((WriteBarrierPtr *)&pMVar21->moduleFunctionIndex);
          (*ppuVar22)[func_1._4_4_] = RVar11;
        }
        (local_110->field_2).funcTableSize = size_00;
        local_110->location = RVar12;
        break;
      case ModuleFunction:
        this_07 = AsmJsFunc::FromSymbol((AsmJsSymbol *)slot);
        iVar8 = moduleEnvCount;
        moduleEnvCount = moduleEnvCount + 1;
        pMVar23 = AsmJsModuleInfo::GetFunction((AsmJsModuleInfo *)nameNode,iVar8);
        RVar12 = AsmJsFunctionDeclaration::GetFunctionIndex
                           (&this_07->super_AsmJsFunctionDeclaration);
        pMVar23->location = RVar12;
        local_110->location = pMVar23->location;
        break;
      case ArrayView:
        this_08 = AsmJsArrayView::FromSymbol((AsmJsSymbol *)slot);
        TVar6 = AsmJsArrayView::GetViewType(this_08);
        (local_110->field_2).varType = TVar6;
        break;
      case MathBuiltinFunction:
        this_11 = AsmJsMathFunction::FromSymbol((AsmJsSymbol *)slot);
        AVar13 = AsmJsMathFunction::GetMathBuiltInFunction(this_11);
        (local_110->field_2).funcTableSize = AVar13;
        break;
      case TypedArrayBuiltinFunction:
        this_12 = AsmJsTypedArrayFunction::FromSymbol((AsmJsSymbol *)slot);
        AVar14 = AsmJsTypedArrayFunction::GetArrayBuiltInFunction(this_12);
        (local_110->field_2).funcTableSize = AVar14;
        break;
      case ModuleArgument:
        this_09 = AsmJsModuleArg::FromSymbol((AsmJsSymbol *)slot);
        AVar7 = AsmJsModuleArg::GetArgType(this_09);
        (local_110->field_2).varType = AVar7;
        break;
      case ClosureFunction:
      }
    }
    sym._4_4_ = sym._4_4_ + 1;
  } while( true );
}

Assistant:

bool AsmJsModuleCompiler::CommitModule()
    {
        FuncInfo* funcInfo = GetModuleFunctionNode()->funcInfo;
        FunctionBody* functionBody = funcInfo->GetParsedFunctionBody();
        AsmJsModuleInfo* asmInfo = functionBody->AllocateAsmJsModuleInfo();

        if (funcInfo->byteCodeFunction->GetIsNamedFunctionExpression())
        {
            Assert(GetModuleFunctionNode()->pnodeName);
            Assert(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl);
            ParseNodeVar * nameNode = GetModuleFunctionNode()->pnodeName;
            if (nameNode->sym->IsInSlot(GetByteCodeGenerator(), funcInfo))
            {
                GetByteCodeGenerator()->AssignPropertyId(nameNode->name());
                // if module is a named function expression, we may need to restore this for debugger
                AsmJsClosureFunction* closure = Anew(&mAllocator, AsmJsClosureFunction, nameNode->pid, AsmJsSymbol::ClosureFunction, &mAllocator);
                DefineIdentifier(nameNode->pid, closure);
            }
        }

        int argCount = 0;
        if (mBufferArgName)
        {
            argCount = 3;
        }
        else if (mForeignArgName)
        {
            argCount = 2;
        }
        else if (mStdLibArgName)
        {
            argCount = 1;
        }

        const int functionCount = mFunctionArray.Count();
        const int functionTableCount = mFunctionTableArray.Count();
        const int importFunctionCount = mImportFunctions.GetTotalVarCount();
        asmInfo->SetFunctionCount(functionCount);
        asmInfo->SetFunctionTableCount(functionTableCount);
        asmInfo->SetFunctionImportCount(importFunctionCount);
        asmInfo->SetVarCount(mVarCount);
        asmInfo->SetVarImportCount(mVarImportCount);
        asmInfo->SetArgInCount(argCount);
        asmInfo->SetModuleMemory(mModuleMemory);
        asmInfo->SetAsmMathBuiltinUsed(mAsmMathBuiltinUsedBV);
        asmInfo->SetAsmArrayBuiltinUsed(mAsmArrayBuiltinUsedBV);
        asmInfo->SetMaxHeapAccess(mMaxHeapAccess);
        int varCount = 3; // 3 possible arguments

        functionBody->SetInParamsCount(4); // Always set 4 inParams so the memory space is the same (globalEnv,stdlib,foreign,buffer)
        functionBody->SetReportedInParamsCount(4);
        functionBody->CheckAndSetConstantCount(2); // Return register + Root
        functionBody->CreateConstantTable();
        functionBody->CheckAndSetVarCount(varCount);
        functionBody->SetIsAsmjsMode(true);
        functionBody->NewObjectLiteral(); // allocate one object literal for the export object

        AsmJSByteCodeGenerator::EmitEmptyByteCode(funcInfo, GetByteCodeGenerator(), GetModuleFunctionNode());

        // Create export module proxy
        asmInfo->SetExportFunctionIndex(mExportFuncIndex);
        asmInfo->SetExportsCount(mExports.Count());
        auto exportIter = mExports.GetIterator();

        for (int exportIndex = 0; exportIter.IsValid(); ++exportIndex)
        {
            const AsmJsModuleExport& exMod = exportIter.CurrentValue();
            auto ex = asmInfo->GetExport(exportIndex);
            *ex.id = exMod.id;
            *ex.location = exMod.location;
            exportIter.MoveNext();
        }

        int iVar = 0, iVarImp = 0, iFunc = 0, iFuncImp = 0;
        const int moduleEnvCount = mModuleEnvironment.Count();
        asmInfo->InitializeSlotMap(moduleEnvCount);
        auto slotMap = asmInfo->GetAsmJsSlotMap();
        for (int i = 0; i < moduleEnvCount; i++)
        {
            AsmJsSymbol* sym = mModuleEnvironment.GetValueAt(i);
            if (sym)
            {
                AsmJsSlot * slot = RecyclerNewLeaf(GetScriptContext()->GetRecycler(), AsmJsSlot);
                slot->symType = sym->GetSymbolType();
                slotMap->AddNew(sym->GetName()->GetPropertyId(), slot);
                switch (sym->GetSymbolType())
                {
                case AsmJsSymbol::Variable:
                {
                    AsmJsVar* var = AsmJsVar::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVar(iVar++);
                    modVar.location = var->GetLocation();
                    modVar.type = var->GetVarType().which();
                    if (var->GetVarType().isInt())
                    {
                        modVar.initialiser.intInit = var->GetIntInitialiser();
                    }
                    else if (var->GetVarType().isFloat())
                    {
                        modVar.initialiser.floatInit = var->GetFloatInitialiser();
                    }
                    else if (var->GetVarType().isDouble())
                    {
                        modVar.initialiser.doubleInit = var->GetDoubleInitialiser();
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }

                    modVar.isMutable = var->isMutable();

                    slot->location = modVar.location;
                    slot->varType = var->GetVarType().which();
                    slot->isConstVar = !modVar.isMutable;
                    break;
                }
                case AsmJsSymbol::ConstantImport:
                {
                    AsmJsConstantImport* var = AsmJsConstantImport::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVarImport(iVarImp++);
                    modVar.location = var->GetLocation();
                    modVar.field = var->GetField()->GetPropertyId();
                    modVar.type = var->GetVarType().which();

                    slot->location = modVar.location;
                    slot->varType = modVar.type;
                    break;
                }
                case AsmJsSymbol::ImportFunction:
                {
                    AsmJsImportFunction* func = AsmJsImportFunction::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunctionImport(iFuncImp++);
                    modVar.location = func->GetFunctionIndex();
                    modVar.field = func->GetField()->GetPropertyId();

                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::FuncPtrTable:
                {
                    AsmJsFunctionTable* funcTable = AsmJsFunctionTable::FromSymbol(sym);
                    const uint size = funcTable->GetSize();
                    const RegSlot index = funcTable->GetFunctionIndex();
                    asmInfo->SetFunctionTableSize(index, size);
                    auto& modTable = asmInfo->GetFunctionTable(index);
                    for (uint j = 0; j < size; j++)
                    {
                        modTable.moduleFunctionIndex[j] = funcTable->GetModuleFunctionIndex(j);
                    }
                    slot->funcTableSize = size;
                    slot->location = index;

                    break;
                }
                case AsmJsSymbol::ModuleFunction:
                {
                    AsmJsFunc* func = AsmJsFunc::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunction(iFunc++);
                    modVar.location = func->GetFunctionIndex();
                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::ArrayView:
                {
                    AsmJsArrayView * var = AsmJsArrayView::FromSymbol(sym);
                    slot->viewType = var->GetViewType();
                    break;
                }
                case AsmJsSymbol::ModuleArgument:
                {
                    AsmJsModuleArg * arg = AsmJsModuleArg::FromSymbol(sym);
                    slot->argType = arg->GetArgType();
                    break;
                }
                // used only for module validation
                case AsmJsSymbol::MathConstant:
                {
                    AsmJsMathConst * constVar = AsmJsMathConst::FromSymbol(sym);
                    slot->mathConstVal = *constVar->GetVal();
                    break;
                }
                case AsmJsSymbol::MathBuiltinFunction:
                {
                    AsmJsMathFunction * mathFunc = AsmJsMathFunction::FromSymbol(sym);
                    slot->builtinMathFunc = mathFunc->GetMathBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::TypedArrayBuiltinFunction:
                {
                    AsmJsTypedArrayFunction * mathFunc = AsmJsTypedArrayFunction::FromSymbol(sym);
                    slot->builtinArrayFunc = mathFunc->GetArrayBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::ClosureFunction:
                    // we don't need to store any additional info in this case
                    break;
                default:
                    Assume(UNREACHED);
                }
            }
        }
        return true;
    }